

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::compileAnnotation(NodeTranslator *this,Reader decl,Builder builder)

{
  StructDataBitCount *this_00;
  Reader source;
  Field field;
  Field field_00;
  Builder target;
  ImplicitParams implicitMethodParams;
  StringPtr name;
  bool bVar1;
  Iterator IVar2;
  Reader local_310;
  RawBrandedSchema *local_2c8;
  Schema SStack_2c0;
  uint local_2b8;
  undefined4 uStack_2b4;
  SegmentReader *pSStack_2b0;
  CapTableReader *local_2a8;
  void *pvStack_2a0;
  WirePointer *local_298;
  StructDataBitCount SStack_290;
  StructPointerCount SStack_28c;
  undefined2 uStack_28a;
  char *local_288;
  char *pcStack_280;
  Schema local_278;
  undefined1 auStack_270 [8];
  Field dstField;
  Reader local_220;
  ArrayPtr<const_char> local_1f0;
  undefined1 auStack_1e0 [8];
  StringPtr fieldName;
  Field srcField;
  undefined1 local_180 [8];
  Iterator __end2;
  undefined1 local_160 [8];
  Iterator __begin2;
  FieldList local_148;
  FieldList *local_110;
  FieldList *__range2;
  Builder dst;
  Reader src;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  Builder local_68;
  Reader local_40;
  NodeTranslator *local_10;
  NodeTranslator *this_local;
  
  local_10 = this;
  Declaration::Annotation::Reader::getType(&local_40,&decl);
  capnp::schema::Node::Annotation::Builder::initType(&local_68,&builder);
  noImplicitParams();
  source._reader.capTable = local_40._reader.capTable;
  source._reader.segment = local_40._reader.segment;
  source._reader.data = local_40._reader.data;
  source._reader.pointers = local_40._reader.pointers;
  source._reader.dataSize = local_40._reader.dataSize;
  source._reader.pointerCount = local_40._reader.pointerCount;
  source._reader._38_2_ = local_40._reader._38_2_;
  source._reader.nestingLimit = local_40._reader.nestingLimit;
  source._reader._44_4_ = local_40._reader._44_4_;
  target._builder.capTable = local_68._builder.capTable;
  target._builder.segment = local_68._builder.segment;
  target._builder.data = local_68._builder.data;
  target._builder.pointers = local_68._builder.pointers;
  target._builder.dataSize = local_68._builder.dataSize;
  target._builder.pointerCount = local_68._builder.pointerCount;
  target._builder._38_2_ = local_68._builder._38_2_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)uStack_98;
  implicitMethodParams.scopeId = src.reader._40_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)local_90;
  implicitMethodParams.params.reader.ptr = (byte *)uStack_88;
  implicitMethodParams.params.reader._24_8_ = local_80;
  implicitMethodParams.params.reader._32_8_ = uStack_78;
  implicitMethodParams.params.reader._40_8_ = local_70;
  compileType(this,source,target,implicitMethodParams);
  this_00 = &dst.builder.dataSize;
  DynamicStruct::Reader::Reader<capnp::compiler::Declaration::Annotation::Reader&,void>
            ((Reader *)this_00,&decl);
  DynamicStruct::Builder::Builder<capnp::schema::Node::Annotation::Builder&,void>
            ((Builder *)&__range2,&builder);
  __begin2._8_8_ = DynamicStruct::Reader::getSchema((Reader *)this_00);
  StructSchema::getFields(&local_148,(StructSchema *)&__begin2.index);
  local_110 = &local_148;
  IVar2 = StructSchema::FieldList::begin(&local_148);
  __end2._8_8_ = IVar2.container;
  __begin2.container._0_4_ = IVar2.index;
  local_160 = (undefined1  [8])__end2._8_8_;
  IVar2 = StructSchema::FieldList::end(local_110);
  local_180 = (undefined1  [8])IVar2.container;
  __end2.container._0_4_ = IVar2.index;
  while (bVar1 = capnp::_::
                 IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                 ::operator!=((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                               *)local_160,
                              (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>
                               *)local_180), bVar1) {
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
    operator*((Field *)&fieldName.content.size_,
              (IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *)
              local_160);
    StructSchema::Field::getProto(&local_220,(Field *)&fieldName.content.size_);
    local_1f0 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&local_220);
    auStack_1e0 = (undefined1  [8])local_1f0.ptr;
    fieldName.content.ptr = (char *)local_1f0.size_;
    kj::StringPtr::StringPtr((StringPtr *)&dstField.proto._reader.nestingLimit,"targets");
    bVar1 = kj::StringPtr::startsWith
                      ((StringPtr *)auStack_1e0,(StringPtr *)&dstField.proto._reader.nestingLimit);
    if (bVar1) {
      local_278.raw = (RawBrandedSchema *)DynamicStruct::Builder::getSchema((Builder *)&__range2);
      local_288 = (char *)auStack_1e0;
      pcStack_280 = fieldName.content.ptr;
      name.content.size_ = (size_t)fieldName.content.ptr;
      name.content.ptr = (char *)auStack_1e0;
      StructSchema::getFieldByName((Field *)auStack_270,(StructSchema *)&local_278,name);
      local_298 = dstField.proto._reader.pointers;
      SStack_290 = dstField.proto._reader.dataSize;
      SStack_28c = dstField.proto._reader.pointerCount;
      uStack_28a = dstField.proto._reader._38_2_;
      local_2a8 = dstField.proto._reader.capTable;
      pvStack_2a0 = dstField.proto._reader.data;
      local_2b8 = dstField.index;
      uStack_2b4 = dstField._12_4_;
      pSStack_2b0 = dstField.proto._reader.segment;
      local_2c8 = (RawBrandedSchema *)auStack_270;
      SStack_2c0 = dstField.parent.super_Schema.raw;
      field._8_8_ = srcField.parent.super_Schema.raw;
      field.parent.super_Schema.raw = (Schema)(Schema)fieldName.content.size_;
      field.proto._reader.segment = (SegmentReader *)srcField._8_8_;
      field.proto._reader.capTable = (CapTableReader *)srcField.proto._reader.segment;
      field.proto._reader.data = srcField.proto._reader.capTable;
      field.proto._reader.pointers = (WirePointer *)srcField.proto._reader.data;
      field.proto._reader._32_8_ = srcField.proto._reader.pointers;
      field.proto._reader._40_8_ = srcField.proto._reader._32_8_;
      DynamicStruct::Reader::get(&local_310,(Reader *)&dst.builder.dataSize,field);
      field_00._8_8_ = SStack_2c0.raw;
      field_00.parent.super_Schema.raw = (Schema)(Schema)local_2c8;
      field_00.proto._reader.segment = (SegmentReader *)_local_2b8;
      field_00.proto._reader.capTable = (CapTableReader *)pSStack_2b0;
      field_00.proto._reader.data = local_2a8;
      field_00.proto._reader.pointers = (WirePointer *)pvStack_2a0;
      field_00.proto._reader._32_8_ = local_298;
      field_00.proto._reader.nestingLimit = SStack_290;
      field_00.proto._reader._44_2_ = SStack_28c;
      field_00.proto._reader._46_2_ = uStack_28a;
      DynamicStruct::Builder::set((Builder *)&__range2,field_00,&local_310);
      DynamicValue::Reader::~Reader(&local_310);
    }
    capnp::_::IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::
    operator++((IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> *
               )local_160);
  }
  return;
}

Assistant:

void NodeTranslator::compileAnnotation(Declaration::Annotation::Reader decl,
                                       schema::Node::Annotation::Builder builder) {
  compileType(decl.getType(), builder.initType(), noImplicitParams());

  // Dynamically copy over the values of all of the "targets" members.
  DynamicStruct::Reader src = decl;
  DynamicStruct::Builder dst = builder;
  for (auto srcField: src.getSchema().getFields()) {
    kj::StringPtr fieldName = srcField.getProto().getName();
    if (fieldName.startsWith("targets")) {
      auto dstField = dst.getSchema().getFieldByName(fieldName);
      dst.set(dstField, src.get(srcField));
    }
  }
}